

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klvwalk.cpp
# Opt level: O2

void __thiscall CommandOptions::CommandOptions(CommandOptions *this,int argc,char **argv)

{
  char cVar1;
  char *__s1;
  int iVar2;
  long lVar3;
  long lVar4;
  allocator<char> local_71;
  long local_70;
  _List_node_base *local_68;
  bool *local_60;
  char **local_58;
  value_type local_50;
  
  this->error_flag = true;
  local_68 = (_List_node_base *)&this->inFileList;
  this->version_flag = false;
  this->help_flag = false;
  this->verbose_flag = false;
  this->read_mxf_flag = false;
  this->walk_parts_flag = false;
  this->allow_skip_flag = false;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = local_68;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = local_68;
  (this->inFileList).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  local_60 = &this->version_flag;
  lVar4 = (long)argc;
  lVar3 = 1;
  local_70 = lVar4;
  local_58 = argv;
  do {
    if (lVar4 <= lVar3) {
      if ((this->help_flag == false) && (*local_60 == false)) {
        if ((((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_68->_M_next)->_M_impl)._M_node.super__List_node_base._M_next == local_68) {
          fputs("Input filename(s) required.\n",_stderr);
        }
        else {
          this->error_flag = false;
        }
      }
      return;
    }
    __s1 = local_58[lVar3];
    iVar2 = strcmp(__s1,"-help");
    if (iVar2 == 0) {
      this->help_flag = true;
    }
    else if (*__s1 == '-') {
      cVar1 = __s1[1];
      iVar2 = isalpha((int)cVar1);
      if ((iVar2 == 0) || (__s1[2] != '\0')) {
switchD_001063cf_caseD_71:
        fprintf(_stderr,"Unrecognized option: %s\n",__s1);
        return;
      }
      lVar4 = local_70;
      switch(cVar1) {
      case 'p':
        this->walk_parts_flag = true;
        break;
      case 'q':
      case 't':
      case 'u':
        goto switchD_001063cf_caseD_71;
      case 'r':
        this->read_mxf_flag = true;
        break;
      case 's':
        this->allow_skip_flag = true;
        break;
      case 'v':
        this->verbose_flag = true;
        break;
      default:
        if (cVar1 == 'V') {
          *local_60 = true;
        }
        else {
          if (cVar1 != 'h') goto switchD_001063cf_caseD_71;
          this->help_flag = true;
        }
      }
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s1,&local_71);
      std::__cxx11::
      list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_68,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

CommandOptions(int argc, const char** argv) :
     error_flag(true), version_flag(false), help_flag(false),
     verbose_flag(false), read_mxf_flag(false), walk_parts_flag(false),
     allow_skip_flag(false)
   {
     for ( int i = 1; i < argc; i++ )
       {

	 if ( (strcmp( argv[i], "-help") == 0) )
	   {
	     help_flag = true;
	     continue;
	   }
         
	 if ( argv[i][0] == '-' && isalpha(argv[i][1]) && argv[i][2] == 0 )
	   {
	     switch ( argv[i][1] )
	       {
	       case 'h': help_flag = true; break;
	       case 'r': read_mxf_flag = true; break;
	       case 'p': walk_parts_flag = true; break;
               case 's': allow_skip_flag = true; break;
	       case 'V': version_flag = true; break;
	       case 'v': verbose_flag = true; break;

	       default:
		 fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
	 else
	   {
	     if ( argv[i][0] != '-' )
	       inFileList.push_back(argv[i]);

	     else
	       {
       	         fprintf(stderr, "Unrecognized option: %s\n", argv[i]);
		 return;
	       }
	   }
       }

     if ( help_flag || version_flag )
       return;
     
     if ( inFileList.empty() )
       {
	 fputs("Input filename(s) required.\n", stderr);
	 return;
       }
     
     error_flag = false;
   }